

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int apiHandleError(sqlite3 *db,int rc)

{
  Lookaside *pLVar1;
  u16 uVar2;
  uint uVar3;
  
  if (rc == 0xc0a || db->mallocFailed != '\0') {
    if ((db->mallocFailed != '\0') && (db->nVdbeExec == 0)) {
      db->mallocFailed = '\0';
      (db->u1).isInterrupted = 0;
      pLVar1 = &db->lookaside;
      pLVar1->bDisable = pLVar1->bDisable - 1;
      if (pLVar1->bDisable == 0) {
        uVar2 = (db->lookaside).szTrue;
      }
      else {
        uVar2 = 0;
      }
      (db->lookaside).sz = uVar2;
    }
    db->errCode = 7;
    uVar3 = 7;
    sqlite3ErrorFinish(db,7);
  }
  else {
    uVar3 = rc & db->errMask;
  }
  return uVar3;
}

Assistant:

static SQLITE_NOINLINE int apiHandleError(sqlite3 *db, int rc){
  if( db->mallocFailed || rc==SQLITE_IOERR_NOMEM ){
    sqlite3OomClear(db);
    sqlite3Error(db, SQLITE_NOMEM);
    return SQLITE_NOMEM_BKPT;
  }
  return rc & db->errMask;
}